

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O2

void __thiscall
spdlog::details::short_level_formatter<spdlog::details::null_scoped_padder>::format
          (short_level_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,tm *param_2
          ,memory_buf_t *dest)

{
  char *__s;
  size_t sVar1;
  
  __s = *(char **)(level::short_level_names + (ulong)msg->level * 8);
  sVar1 = strlen(__s);
  fmt::v6::internal::buffer<char>::append<char>(&dest->super_buffer<char>,__s,__s + sVar1);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        string_view_t level_name{level::to_short_c_str(msg.level)};
        ScopedPadder p(level_name.size(), padinfo_, dest);
        fmt_helper::append_string_view(level_name, dest);
    }